

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

qint64 __thiscall QFileInfo::size(QFileInfo *this)

{
  uint uVar1;
  QFileInfoPrivate *pQVar2;
  qint64 qVar3;
  long lVar4;
  
  pQVar2 = (this->d_ptr).d.ptr;
  uVar1 = *(uint *)&pQVar2->field_0x1d8;
  if ((uVar1 >> 0x1e & 1) == 0) {
    if ((QAbstractFileEngine *)
        (pQVar2->fileEngine)._M_t.
        super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
        super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
        super__Head_base<0UL,_QAbstractFileEngine_*,_false> == (QAbstractFileEngine *)0x0) {
      if ((-1 < (int)uVar1) ||
         (lVar4 = 0x48,
         (*(byte *)((long)&(pQVar2->metaData).knownFlagsMask.
                           super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                           super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 2) & 0x20) ==
         0)) {
        QFileSystemEngine::fillMetaData
                  (&pQVar2->fileEntry,&pQVar2->metaData,(MetaDataFlags)0x200000);
        lVar4 = 0x48;
      }
    }
    else {
      lVar4 = 0x1e0;
      if ((~uVar1 & 0x80000008) != 0) {
        if ((int)uVar1 < 0) {
          *(uint *)&pQVar2->field_0x1d8 = uVar1 | 8;
        }
        qVar3 = (**(code **)(*(long *)(pQVar2->fileEngine)._M_t.
                                      super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                                      .super__Head_base<0UL,_QAbstractFileEngine_*,_false> + 0x30))
                          ();
        pQVar2->fileSize = qVar3;
      }
    }
    qVar3 = *(qint64 *)((long)pQVar2->fileNames + lVar4 + -0x80);
  }
  else {
    qVar3 = 0;
  }
  return qVar3;
}

Assistant:

constexpr P get() const noexcept { return ptr; }